

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

int corpus_load_lattice(s3lattice_t **out_lattice,char *lat_dir,char *lat_ext)

{
  int iVar1;
  char *pcVar2;
  char fn [1024];
  char acStack_418 [1032];
  
  pcVar2 = cur_ctl_utt_id;
  if (cur_ctl_utt_id == (char *)0x0) {
    pcVar2 = cur_ctl_path;
  }
  sprintf(acStack_418,"%s/%s.%s",lat_dir,pcVar2,lat_ext);
  iVar1 = s3lattice_read(acStack_418,out_lattice);
  return iVar1 >> 0x1f;
}

Assistant:

int
corpus_load_lattice(s3lattice_t **out_lattice, const char *lat_dir, const char *lat_ext)
{
    char *rel_path;
    char fn[1024];

    /* If control file specifies an utt ID, use it.  O/W use the path */
    if (cur_ctl_utt_id != NULL)
	rel_path = cur_ctl_utt_id;
    else {
	rel_path = cur_ctl_path;
    }

    sprintf(fn, "%s/%s.%s",  lat_dir, rel_path, lat_ext);
    if (s3lattice_read(fn, out_lattice) < 0)
	return S3_ERROR;
    
    return S3_SUCCESS;
}